

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O0

string * __thiscall
cpptrace::microfmt::format<unsigned_int&,unsigned_long&>
          (string *__return_storage_ptr__,microfmt *this,char *fmt,uint *args,unsigned_long *args_1)

{
  array<cpptrace::microfmt::detail::format_value,_2UL> args_00;
  char *fmt_end;
  microfmt *fmt_begin;
  anon_union_16_6_5e21074f_for_format_value_0 local_58;
  undefined8 local_48;
  anon_union_16_6_5e21074f_for_format_value_0 aStack_40;
  undefined8 uStack_30;
  unsigned_long *local_28;
  unsigned_long *args_local_1;
  uint *args_local;
  char *fmt_local;
  
  local_28 = (unsigned_long *)args;
  args_local_1 = (unsigned_long *)fmt;
  args_local = (uint *)this;
  fmt_local = (char *)__return_storage_ptr__;
  fmt_end = (char *)strlen((char *)this);
  fmt_begin = this + (long)fmt_end;
  detail::format_value::format_value
            ((format_value *)&local_58.string_view_value,(uint)*args_local_1);
  detail::format_value::format_value((format_value *)&aStack_40.string_view_value,*local_28);
  args_00._M_elems[0].field_0.string_view_value._M_str = local_58.string_view_value._M_str;
  args_00._M_elems[0].field_0.int64_value = local_58.int64_value;
  args_00._M_elems[0]._16_8_ = local_48;
  args_00._M_elems[1].field_0.int64_value = aStack_40.int64_value;
  args_00._M_elems[1].field_0.string_view_value._M_str = aStack_40.string_view_value._M_str;
  args_00._M_elems[1]._16_8_ = uStack_30;
  detail::format<2ul,char_const*>
            (__return_storage_ptr__,(detail *)this,(char *)fmt_begin,fmt_end,args_00);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, Args&&... args) {
        return detail::format<sizeof...(args)>(fmt, fmt + std::strlen(fmt), {detail::format_value(args)...});
    }